

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

void Shr_ManAddFanout(Shr_Man_t *p,int iFanin,int iFanout)

{
  int iVar1;
  
  iVar1 = Vec_IntEntry(p->vObj2Fan,iFanin);
  Vec_IntWriteEntry(p->vObj2Fan,iFanin,p->vFanMem->nSize);
  Vec_WrdPush(p->vFanMem,CONCAT44(iVar1,iFanout));
  return;
}

Assistant:

static inline void Shr_ManAddFanout( Shr_Man_t * p, int iFanin, int iFanout )
{
    union {
        Shr_Fan_t sFan;
        word      sWord;
    } FanStr;
    FanStr.sFan.iFan = iFanout;
    FanStr.sFan.Next = Vec_IntEntry(p->vObj2Fan, iFanin);
    Vec_IntWriteEntry( p->vObj2Fan, iFanin, Vec_WrdSize(p->vFanMem) );
    Vec_WrdPush(p->vFanMem, FanStr.sWord );
}